

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void tcu::astc::decompress
               (PixelBufferAccess *dst,deUint8 *data,CompressedTexFormat format,AstcMode mode)

{
  uint blockWidth;
  int blockHeight;
  bool isSRGB;
  long lVar1;
  long lVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  Block128 blockData;
  anon_union_2304_2_1776bc36 decompressedBuffer;
  int local_95c;
  Vec4 local_950;
  Block128 local_940;
  float local_930 [576];
  
  isSRGB = isAstcSRGBFormat(format);
  blockWidth = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  blockHeight = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  lVar2 = 0;
  do {
    local_940.m_words[lVar2] = 0;
    lVar1 = 0;
    uVar5 = 0;
    pbVar4 = data;
    do {
      uVar5 = uVar5 | (ulong)*pbVar4 << ((byte)lVar1 & 0x3f);
      lVar1 = lVar1 + 8;
      pbVar4 = pbVar4 + 1;
    } while (lVar1 != 0x40);
    local_940.m_words[lVar2] = uVar5;
    data = data + 8;
    bVar7 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar7);
  anon_unknown_0::decompressBlock
            (local_930,&local_940,blockWidth,blockHeight,isSRGB,mode == ASTCMODE_LDR || isSRGB);
  if (isSRGB) {
    if (0 < blockHeight) {
      iVar6 = 0;
      local_95c = 3;
      do {
        if (0 < (int)blockWidth) {
          uVar5 = 0;
          iVar3 = local_95c;
          do {
            local_950.m_data[0] = (float)(uint)*(byte *)((long)local_930 + (long)(iVar3 + -3));
            local_950.m_data[1] = (float)(uint)*(byte *)((long)local_930 + (long)(iVar3 + -2));
            local_950.m_data[2] = (float)(uint)*(byte *)((long)local_930 + (long)(iVar3 + -1));
            local_950.m_data[3] = (float)(uint)*(byte *)((long)local_930 + (long)iVar3);
            PixelBufferAccess::setPixel(dst,(IVec4 *)&local_950,(int)uVar5,iVar6,0);
            uVar5 = uVar5 + 1;
            iVar3 = iVar3 + 4;
          } while (blockWidth != uVar5);
        }
        iVar6 = iVar6 + 1;
        local_95c = local_95c + blockWidth * 4;
      } while (iVar6 != blockHeight);
    }
  }
  else if (0 < blockHeight) {
    iVar6 = 0;
    local_95c = 3;
    do {
      if (0 < (int)blockWidth) {
        uVar5 = 0;
        iVar3 = local_95c;
        do {
          local_950.m_data[0] = local_930[iVar3 + -3];
          local_950.m_data[1] = local_930[iVar3 + -2];
          local_950.m_data[2] = local_930[iVar3 + -1];
          local_950.m_data[3] = local_930[iVar3];
          PixelBufferAccess::setPixel(dst,&local_950,(int)uVar5,iVar6,0);
          uVar5 = uVar5 + 1;
          iVar3 = iVar3 + 4;
        } while (blockWidth != uVar5);
      }
      iVar6 = iVar6 + 1;
      local_95c = local_95c + blockWidth * 4;
    } while (iVar6 != blockHeight);
  }
  return;
}

Assistant:

void decompress (const PixelBufferAccess& dst, const deUint8* data, CompressedTexFormat format, TexDecompressionParams::AstcMode mode)
{
	const bool			isSRGBFormat	= isAstcSRGBFormat(format);

#if defined(DE_DEBUG)
	const tcu::IVec3	blockPixelSize	= getBlockPixelSize(format);

	DE_ASSERT(dst.getWidth()	== blockPixelSize.x() &&
			  dst.getHeight()	== blockPixelSize.y() &&
			  dst.getDepth()	== blockPixelSize.z());
	DE_ASSERT(mode == TexDecompressionParams::ASTCMODE_LDR || mode == TexDecompressionParams::ASTCMODE_HDR);
#endif

	// sRGB is not supported in HDR mode
	DE_ASSERT(!(mode == TexDecompressionParams::ASTCMODE_HDR && isSRGBFormat));

	decompress(dst, data, isSRGBFormat, isSRGBFormat || mode == TexDecompressionParams::ASTCMODE_LDR);
}